

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage_info.cpp
# Opt level: O1

string * __thiscall
duckdb::GetStorageVersionName_abi_cxx11_
          (string *__return_storage_ptr__,duckdb *this,idx_t serialization_version)

{
  long lVar1;
  int iVar2;
  long *plVar3;
  size_type *psVar4;
  char *pcVar5;
  undefined8 *puVar6;
  char *pcVar7;
  idx_t i;
  idx_t iVar8;
  allocator local_59;
  optional_idx local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  if (this < (duckdb *)0x4) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar7 = "v1.0.0+";
    pcVar5 = "";
  }
  else {
    local_58.index = 0xffffffffffffffff;
    pcVar5 = "v0.10.0";
    puVar6 = (undefined8 *)(serialization_version_info + 0x10);
    iVar8 = 0;
    do {
      iVar2 = strcmp(pcVar5,"latest");
      if (((iVar2 != 0) && ((duckdb *)puVar6[-1] == this)) && (local_58.index == 0xffffffffffffffff)
         ) {
        optional_idx::optional_idx(&local_58,iVar8);
      }
      iVar8 = iVar8 + 1;
      pcVar5 = (char *)*puVar6;
      puVar6 = puVar6 + 2;
    } while (iVar8 != 0xe);
    if (local_58.index != 0xffffffffffffffff) {
      iVar8 = optional_idx::GetIndex(&local_58);
      ::std::__cxx11::string::string
                ((string *)local_50,*(char **)(serialization_version_info + iVar8 * 0x10),&local_59)
      ;
      plVar3 = (long *)::std::__cxx11::string::append((char *)local_50);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar4 = (size_type *)(plVar3 + 2);
      if ((size_type *)*plVar3 == psVar4) {
        lVar1 = plVar3[3];
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
        *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
      }
      __return_storage_ptr__->_M_string_length = plVar3[1];
      *plVar3 = (long)psVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      if (local_50[0] == local_40) {
        return __return_storage_ptr__;
      }
      operator_delete(local_50[0]);
      return __return_storage_ptr__;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar7 = "--UNKNOWN--";
    pcVar5 = "";
  }
  ::std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar7,pcVar5);
  return __return_storage_ptr__;
}

Assistant:

string GetStorageVersionName(idx_t serialization_version) {
	if (serialization_version < 4) {
		// special handling for lower serialization versions
		return "v1.0.0+";
	}
	optional_idx min_idx;
	for (idx_t i = 0; serialization_version_info[i].version_name; i++) {
		if (strcmp(serialization_version_info[i].version_name, "latest") == 0) {
			continue;
		}
		if (serialization_version_info[i].serialization_version != serialization_version) {
			continue;
		}
		if (!min_idx.IsValid()) {
			min_idx = i;
		}
	}
	if (!min_idx.IsValid()) {
		D_ASSERT(0);
		return "--UNKNOWN--";
	}
	auto min_name = serialization_version_info[min_idx.GetIndex()].version_name;
	return string(min_name) + "+";
}